

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

opj_worker_thread_job_t *
opj_thread_pool_get_next_job
          (opj_thread_pool_t *tp,opj_worker_thread_t *worker_thread,OPJ_BOOL signal_job_finished)

{
  opj_job_list_t *ptr;
  opj_worker_thread_job_t *poVar1;
  opj_worker_thread_list_t *poVar2;
  opj_worker_thread_list_t *item;
  opj_worker_thread_job_t *job;
  opj_job_list_t *top_job_iter;
  OPJ_BOOL signal_job_finished_local;
  opj_worker_thread_t *worker_thread_local;
  opj_thread_pool_t *tp_local;
  
  top_job_iter._4_4_ = signal_job_finished;
  do {
    opj_mutex_lock(tp->mutex);
    if (top_job_iter._4_4_ != 0) {
      top_job_iter._4_4_ = 0;
      tp->pending_jobs_count = tp->pending_jobs_count + -1;
      if (tp->pending_jobs_count <= tp->signaling_threshold) {
        opj_cond_signal(tp->cond);
      }
    }
    if (tp->state == OPJWTS_STOP) {
      opj_mutex_unlock(tp->mutex);
      return (opj_worker_thread_job_t *)0x0;
    }
    ptr = tp->job_queue;
    if (ptr != (opj_job_list_t *)0x0) {
      tp->job_queue = ptr->next;
      poVar1 = ptr->job;
      opj_mutex_unlock(tp->mutex);
      opj_free(ptr);
      return poVar1;
    }
    if (worker_thread->marked_as_waiting == 0) {
      worker_thread->marked_as_waiting = 1;
      tp->waiting_worker_thread_count = tp->waiting_worker_thread_count + 1;
      if (tp->worker_threads_count < tp->waiting_worker_thread_count) {
        __assert_fail("tp->waiting_worker_thread_count <= tp->worker_threads_count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/thread.c"
                      ,0x31d,
                      "opj_worker_thread_job_t *opj_thread_pool_get_next_job(opj_thread_pool_t *, opj_worker_thread_t *, OPJ_BOOL)"
                     );
      }
      poVar2 = (opj_worker_thread_list_t *)opj_malloc(0x10);
      if (poVar2 == (opj_worker_thread_list_t *)0x0) {
        tp->state = OPJWTS_ERROR;
        opj_cond_signal(tp->cond);
        opj_mutex_unlock(tp->mutex);
        return (opj_worker_thread_job_t *)0x0;
      }
      poVar2->worker_thread = worker_thread;
      poVar2->next = tp->waiting_worker_thread_list;
      tp->waiting_worker_thread_list = poVar2;
    }
    opj_cond_signal(tp->cond);
    opj_mutex_lock(worker_thread->mutex);
    opj_mutex_unlock(tp->mutex);
    opj_cond_wait(worker_thread->cond,worker_thread->mutex);
    opj_mutex_unlock(worker_thread->mutex);
  } while( true );
}

Assistant:

static opj_worker_thread_job_t* opj_thread_pool_get_next_job(
    opj_thread_pool_t* tp,
    opj_worker_thread_t* worker_thread,
    OPJ_BOOL signal_job_finished)
{
    while (OPJ_TRUE) {
        opj_job_list_t* top_job_iter;

        opj_mutex_lock(tp->mutex);

        if (signal_job_finished) {
            signal_job_finished = OPJ_FALSE;
            tp->pending_jobs_count --;
            /*printf("tp=%p, remaining jobs: %d\n", tp, tp->pending_jobs_count);*/
            if (tp->pending_jobs_count <= tp->signaling_threshold) {
                opj_cond_signal(tp->cond);
            }
        }

        if (tp->state == OPJWTS_STOP) {
            opj_mutex_unlock(tp->mutex);
            return NULL;
        }
        top_job_iter = tp->job_queue;
        if (top_job_iter) {
            opj_worker_thread_job_t* job;
            tp->job_queue = top_job_iter->next;

            job = top_job_iter->job;
            opj_mutex_unlock(tp->mutex);
            opj_free(top_job_iter);
            return job;
        }

        /* opj_waiting(); */
        if (!worker_thread->marked_as_waiting) {
            opj_worker_thread_list_t* item;

            worker_thread->marked_as_waiting = OPJ_TRUE;
            tp->waiting_worker_thread_count ++;
            assert(tp->waiting_worker_thread_count <= tp->worker_threads_count);

            item = (opj_worker_thread_list_t*) opj_malloc(sizeof(opj_worker_thread_list_t));
            if (item == NULL) {
                tp->state = OPJWTS_ERROR;
                opj_cond_signal(tp->cond);

                opj_mutex_unlock(tp->mutex);
                return NULL;
            }

            item->worker_thread = worker_thread;
            item->next = tp->waiting_worker_thread_list;
            tp->waiting_worker_thread_list = item;
        }

        /* printf("signaling that worker thread is ready\n"); */
        opj_cond_signal(tp->cond);

        opj_mutex_lock(worker_thread->mutex);
        opj_mutex_unlock(tp->mutex);

        /* printf("waiting for job\n"); */
        opj_cond_wait(worker_thread->cond, worker_thread->mutex);

        opj_mutex_unlock(worker_thread->mutex);
        /* printf("got job\n"); */
    }
}